

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodemap_edit.cc
# Opt level: O2

void rcg::anon_unknown_0::addNodeToList
               (vector<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                *list,INode *node,int level)

{
  pointer *ppNVar1;
  pointer pNVar2;
  pointer pNVar3;
  pointer pNVar4;
  int iVar5;
  pointer pNVar6;
  long *plVar7;
  ulong uVar8;
  undefined8 *puVar9;
  INode *pIVar10;
  pointer pNVar11;
  ulong uVar12;
  size_t i;
  ulong uVar13;
  FeatureList_t feature;
  
  iVar5 = (*(code *)**(undefined8 **)(node + *(long *)(*(long *)node + -0x28)))
                    (node + *(long *)(*(long *)node + -0x28));
  if (iVar5 != 0) {
    pNVar2 = (list->
             super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pNVar2 == (list->
                  super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pNVar3 = (list->
               super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((long)pNVar2 - (long)pNVar3 == 0x7ffffffffffffff0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar8 = (long)pNVar2 - (long)pNVar3 >> 4;
      uVar13 = 1;
      if (pNVar2 != pNVar3) {
        uVar13 = uVar8;
      }
      uVar12 = uVar13 + uVar8;
      if (0x7fffffffffffffe < uVar12) {
        uVar12 = 0x7ffffffffffffff;
      }
      if (CARRY8(uVar13,uVar8)) {
        uVar12 = 0x7ffffffffffffff;
      }
      if (uVar12 == 0) {
        pNVar6 = (pointer)0x0;
      }
      else {
        pNVar6 = (pointer)operator_new(uVar12 << 4);
      }
      pNVar6[uVar8].level = level;
      pNVar6[uVar8].node = node;
      pNVar4 = pNVar6;
      for (pNVar11 = pNVar3; pNVar11 != pNVar2; pNVar11 = pNVar11 + 1) {
        iVar5 = pNVar11->value_column;
        pIVar10 = pNVar11->node;
        pNVar4->level = pNVar11->level;
        pNVar4->value_column = iVar5;
        pNVar4->node = pIVar10;
        pNVar4 = pNVar4 + 1;
      }
      if (pNVar3 != (pointer)0x0) {
        operator_delete(pNVar3);
      }
      (list->
      super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
      )._M_impl.super__Vector_impl_data._M_start = pNVar6;
      (list->
      super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
      )._M_impl.super__Vector_impl_data._M_finish = pNVar4 + 1;
      (list->
      super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pNVar6 + uVar12;
    }
    else {
      pNVar2->level = level;
      pNVar2->node = node;
      ppNVar1 = &(list->
                 super__Vector_base<rcg::(anonymous_namespace)::NodeParam,_std::allocator<rcg::(anonymous_namespace)::NodeParam>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
    iVar5 = (**(code **)(*(long *)node + 0xf0))(node);
    if (iVar5 == 8) {
      plVar7 = (long *)__dynamic_cast(node,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::ICategory::typeinfo,0xfffffffffffffffe);
      if (plVar7 != (long *)0x0) {
        GenApi_3_4::value_vector::value_vector(&feature);
        (**(code **)(*plVar7 + 0x38))(plVar7,&feature);
        uVar13 = 0;
        while( true ) {
          uVar8 = GenApi_3_4::value_vector::size();
          if (uVar8 <= uVar13) break;
          puVar9 = (undefined8 *)GenApi_3_4::value_vector::operator[]((ulong)&feature);
          pIVar10 = (INode *)(**(code **)(*(long *)*puVar9 + 0x18))();
          addNodeToList(list,pIVar10,level + 1);
          uVar13 = uVar13 + 1;
        }
        GenApi_3_4::value_vector::~value_vector(&feature);
      }
    }
  }
  return;
}

Assistant:

void addNodeToList(std::vector<NodeParam> &list, GenApi::INode *node, int level)
{
  if (node->GetAccessMode() != GenApi::NI)
  {
    list.push_back(NodeParam(level, node));

    if (node->GetPrincipalInterfaceType() == GenApi::intfICategory)
    {
      GenApi::ICategory *root=dynamic_cast<GenApi::ICategory *>(node);

      if (root != 0)
      {
        GenApi::FeatureList_t feature;
        root->GetFeatures(feature);

        level++;
        for (size_t i=0; i<feature.size(); i++)
        {
          addNodeToList(list, feature[i]->GetNode(), level);
        }
      }
    }
  }
}